

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O1

bool __thiscall flatbuffers::php::PhpGenerator::GenerateEnums(PhpGenerator *this)

{
  Parser *pPVar1;
  EnumDef *enum_def;
  bool bVar2;
  pointer ppEVar3;
  bool bVar4;
  string enumcode;
  string local_50;
  
  pPVar1 = (this->super_BaseGenerator).parser_;
  ppEVar3 = (pPVar1->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar4 = ppEVar3 ==
          (pPVar1->enums_).vec.
          super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if (!bVar4) {
    do {
      enum_def = *ppEVar3;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      GenEnum(enum_def,&local_50);
      bVar2 = SaveType(this,&enum_def->super_Definition,&local_50,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar2) {
        return bVar4;
      }
      ppEVar3 = ppEVar3 + 1;
      bVar4 = ppEVar3 ==
              (((this->super_BaseGenerator).parser_)->enums_).vec.
              super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar4);
  }
  return bVar4;
}

Assistant:

bool GenerateEnums() {
    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      auto &enum_def = **it;
      std::string enumcode;
      GenEnum(enum_def, &enumcode);
      if (!SaveType(enum_def, enumcode, false)) return false;
    }
    return true;
  }